

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall google::protobuf::compiler::python::Generator::PrintImports(Generator *this)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *filename;
  int iVar3;
  FileDescriptor *pFVar4;
  char **ppcVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  long lVar10;
  int index;
  ulong uVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  string module_name;
  string module_alias;
  string local_138;
  string local_118;
  Generator *local_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  pFVar4 = this->file_;
  if (0 < *(int *)(pFVar4 + 0x18)) {
    paVar2 = &local_d0.field_2;
    index = 0;
    local_f8 = this;
    do {
      pFVar4 = FileDescriptor::dependency(pFVar4,index);
      filename = *(string **)pFVar4;
      anon_unknown_0::ModuleName(&local_118,filename);
      anon_unknown_0::ModuleAlias(&local_70,filename);
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      SplitStringUsing(&local_118,".",
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_138);
      if ((pointer)local_138._M_string_length != local_138._M_dataplus._M_p) {
        lVar10 = 0;
        uVar11 = 0;
        do {
          ppcVar5 = std::
                    __find_if<char_const*const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              ((anonymous_namespace)::kKeywords,&ruby::Generator::vtable,
                               local_138._M_dataplus._M_p + lVar10);
          if (ppcVar5 != (char **)&ruby::Generator::vtable) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_138);
            this = local_f8;
            io::Printer::Print(local_f8->printer_,"import importlib\n");
            io::Printer::Print(this->printer_,"$alias$ = importlib.import_module(\'$name$\')\n",
                               "alias",&local_70,"name",&local_118);
            goto LAB_0023f4f0;
          }
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 0x20;
        } while (uVar11 < (ulong)((long)(local_138._M_string_length -
                                        (long)local_138._M_dataplus._M_p) >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_138);
      iVar3 = std::__cxx11::string::rfind((char)&local_118,0x2e);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity =
           local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if (iVar3 == -1) {
        std::operator+(&local_d0,"import ",&local_118);
        std::__cxx11::string::operator=((string *)&local_138,(string *)&local_d0);
        this = local_f8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          this = local_f8;
        }
      }
      else {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_118);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3ade2a);
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_80 = *plVar8;
          lStack_78 = plVar6[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar8;
          local_90 = (long *)*plVar6;
        }
        local_88 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_f0 = &local_e0;
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_e0 = *puVar9;
          lStack_d8 = plVar6[3];
        }
        else {
          local_e0 = *puVar9;
          local_f0 = (ulong *)*plVar6;
        }
        local_e8 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_118);
        this = local_f8;
        uVar11 = 0xf;
        if (local_f0 != &local_e0) {
          uVar11 = local_e0;
        }
        if (uVar11 < (ulong)(local_a8 + local_e8)) {
          uVar11 = 0xf;
          if (local_b0 != local_a0) {
            uVar11 = local_a0[0];
          }
          if (uVar11 < (ulong)(local_a8 + local_e8)) goto LAB_0023f39f;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_f0);
        }
        else {
LAB_0023f39f:
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_b0);
        }
        psVar1 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_d0.field_2._M_allocated_capacity = *psVar1;
          local_d0.field_2._8_8_ = puVar7[3];
          local_d0._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar1;
          local_d0._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_d0._M_string_length = puVar7[1];
        *puVar7 = psVar1;
        puVar7[1] = 0;
        *(undefined1 *)psVar1 = 0;
        std::__cxx11::string::operator=((string *)&local_138,(string *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if (local_b0 != local_a0) {
          operator_delete(local_b0,local_a0[0] + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      io::Printer::Print(this->printer_,"$statement$ as $alias$\n","statement",&local_138,"alias",
                         &local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
LAB_0023f4f0:
      pFVar4 = FileDescriptor::dependency(this->file_,index);
      CopyPublicDependenciesAliases(this,&local_70,pFVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      index = index + 1;
      pFVar4 = this->file_;
    } while (index < *(int *)(pFVar4 + 0x18));
  }
  io::Printer::Print(this->printer_,"\n");
  pFVar4 = this->file_;
  if (0 < *(int *)(pFVar4 + 0x38)) {
    lVar10 = 0;
    do {
      pFVar4 = FileDescriptor::dependency(pFVar4,*(int *)(*(long *)(pFVar4 + 0x40) + lVar10 * 4));
      anon_unknown_0::ModuleName(&local_118,*(string **)pFVar4);
      io::Printer::Print(this->printer_,"from $module$ import *\n","module",&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      lVar10 = lVar10 + 1;
      pFVar4 = this->file_;
    } while (lVar10 < *(int *)(pFVar4 + 0x38));
  }
  io::Printer::Print(this->printer_,"\n");
  return;
}

Assistant:

void Generator::PrintImports() const {
  for (int i = 0; i < file_->dependency_count(); ++i) {
    const string& filename = file_->dependency(i)->name();

    string module_name = ModuleName(filename);
    string module_alias = ModuleAlias(filename);
    if (ContainsPythonKeyword(module_name)) {
      // If the module path contains a Python keyword, we have to quote the
      // module name and import it using importlib. Otherwise the usual kind of
      // import statement would result in a syntax error from the presence of
      // the keyword.
      printer_->Print("import importlib\n");
      printer_->Print("$alias$ = importlib.import_module('$name$')\n", "alias",
                      module_alias, "name", module_name);
    } else {
      int last_dot_pos = module_name.rfind('.');
      string import_statement;
      if (last_dot_pos == string::npos) {
        // NOTE(petya): this is not tested as it would require a protocol buffer
        // outside of any package, and I don't think that is easily achievable.
        import_statement = "import " + module_name;
      } else {
        import_statement = "from " + module_name.substr(0, last_dot_pos) +
                           " import " + module_name.substr(last_dot_pos + 1);
      }
      printer_->Print("$statement$ as $alias$\n", "statement", import_statement,
                      "alias", module_alias);
    }

    CopyPublicDependenciesAliases(module_alias, file_->dependency(i));
  }
  printer_->Print("\n");

  // Print public imports.
  for (int i = 0; i < file_->public_dependency_count(); ++i) {
    string module_name = ModuleName(file_->public_dependency(i)->name());
    printer_->Print("from $module$ import *\n", "module", module_name);
  }
  printer_->Print("\n");
}